

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int calc_bank_base(void)

{
  undefined4 local_c;
  int base;
  
  if (cd_opt == 0) {
    if (scd_opt == 0) {
      if ((develo_opt == 0) && (mx_opt == 0)) {
        local_c = 0;
      }
      else if (max_bank < 4) {
        local_c = 0x84;
      }
      else {
        local_c = 0x68;
      }
    }
    else {
      local_c = 0x68;
    }
  }
  else {
    local_c = 0x80;
  }
  return local_c;
}

Assistant:

int
calc_bank_base(void)
{
	int base;

	/* cd */
	if (cd_opt)
		base = 0x80;

	/* super cd */
	else if (scd_opt)
		base = 0x68;

	/* develo */
	else if (develo_opt || mx_opt) {
		if (max_bank < 4)
			base = 0x84;
		else
			base = 0x68;
	}

	/* default */
	else {
		base = 0;
	}

	return (base);
}